

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-table.c
# Opt level: O0

_Bool Curl_uint_tbl_add(uint_tbl *tbl,void *entry,uint *pkey)

{
  uint local_34;
  uint local_2c;
  uint start_pos;
  uint key;
  uint *pkey_local;
  void *entry_local;
  uint_tbl *tbl_local;
  
  if (((entry != (void *)0x0) && (pkey != (uint *)0x0)) &&
     (*pkey = 0xffffffff, tbl->nentries != tbl->nrows)) {
    if (tbl->last_key_added < tbl->nrows) {
      local_34 = tbl->last_key_added;
    }
    else {
      local_34 = tbl->nrows;
    }
    for (local_2c = local_34 + 1; local_2c < tbl->nrows; local_2c = local_2c + 1) {
      if (tbl->rows[local_2c] == (void *)0x0) {
        tbl->rows[local_2c] = entry;
        tbl->nentries = tbl->nentries + 1;
        tbl->last_key_added = local_2c;
        *pkey = local_2c;
        return true;
      }
    }
    for (local_2c = 0; local_2c < local_34 + 1; local_2c = local_2c + 1) {
      if (tbl->rows[local_2c] == (void *)0x0) {
        tbl->rows[local_2c] = entry;
        tbl->nentries = tbl->nentries + 1;
        tbl->last_key_added = local_2c;
        *pkey = local_2c;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Curl_uint_tbl_add(struct uint_tbl *tbl, void *entry, unsigned int *pkey)
{
  unsigned int key, start_pos;

  DEBUGASSERT(tbl->init == CURL_UINT_TBL_MAGIC);
  if(!entry || !pkey)
    return FALSE;
  *pkey = UINT_MAX; /* always invalid */
  if(tbl->nentries == tbl->nrows)  /* full */
    return FALSE;

  start_pos = CURLMIN(tbl->last_key_added, tbl->nrows) + 1;
  for(key = start_pos; key < tbl->nrows; ++key) {
    if(!tbl->rows[key]) {
      tbl->rows[key] = entry;
      tbl->nentries++;
      tbl->last_key_added = key;
      *pkey = key;
      return TRUE;
    }
  }
  /* no free entry at or above tbl->maybe_next_key, wrap around */
  for(key = 0; key < start_pos; ++key) {
    if(!tbl->rows[key]) {
      tbl->rows[key] = entry;
      tbl->nentries++;
      tbl->last_key_added = key;
      *pkey = key;
      return TRUE;
    }
  }
  /* Did not find any free row? Should not happen */
  DEBUGASSERT(0);
  return FALSE;
}